

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex.cpp
# Opt level: O2

int Cortex_FreeBodyDefs(sBodyDefs *pBodyDefs)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)pBodyDefs->nBodyDefs;
  if (pBodyDefs->nBodyDefs < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 * 0x40 != uVar2; uVar2 = uVar2 + 0x40) {
    free(*(void **)((long)&pBodyDefs->BodyDefs[0].szMarkerNames + uVar2));
    free(*(void **)((long)&pBodyDefs->BodyDefs[0].Hierarchy.szSegmentNames + uVar2));
    free(*(void **)((long)&pBodyDefs->BodyDefs[0].Hierarchy.iParents + uVar2));
    free(*(void **)((long)&pBodyDefs->BodyDefs[0].szDofNames + uVar2));
  }
  free(pBodyDefs->szAnalogChannelNames);
  free(pBodyDefs->AllocatedSpace);
  free(pBodyDefs);
  return 0;
}

Assistant:

int Cortex_FreeBodyDefs(sBodyDefs* pBodyDefs)
{
  int nBodies = pBodyDefs->nBodyDefs;
  int iBody;

  for (iBody = 0; iBody < nBodies; iBody++) {
    sBodyDef *pBody = &pBodyDefs->BodyDefs[iBody];

    // Free each array of pointers to the names
    if (pBody->szMarkerNames != NULL)
      free(pBody->szMarkerNames);
    if (pBody->Hierarchy.szSegmentNames != NULL)
      free(pBody->Hierarchy.szSegmentNames);
    if (pBody->Hierarchy.iParents != NULL)
      free(pBody->Hierarchy.iParents);
    if (pBody->szDofNames != NULL)
      free(pBody->szDofNames);
  }

  if (pBodyDefs->szAnalogChannelNames != NULL)
    free(pBodyDefs->szAnalogChannelNames);

  // Free the big space that contains all the names
  if (pBodyDefs->AllocatedSpace != NULL)
    free(pBodyDefs->AllocatedSpace);
  memset(pBodyDefs, 0, sizeof(sBodyDef)); // not needed anymore
  free(pBodyDefs);

  return RC_Okay;
}